

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O3

void down_sample_uv(int uiCWidth,int uiCHeight,int bitDept,pel *pSrc,int uiSrcStride,pel *pDst,
                   int uiDstStride)

{
  int iVar1;
  int iVar2;
  long lVar3;
  pel pVar4;
  long lVar5;
  int iVar6;
  pel pVar7;
  
  if (0 < uiCHeight) {
    iVar2 = 0;
    do {
      if (0 < uiCWidth) {
        iVar6 = 1;
        lVar3 = 0;
        lVar5 = 0;
        do {
          iVar1 = (int)lVar3;
          if (lVar3 == 0) {
            pVar7 = (pel)((uint)pSrc[uiSrcStride] + (uint)*pSrc + 1 >> 1);
            pVar4 = (pel)((uint)pSrc[1] + (uint)pSrc[(long)uiSrcStride + 1] + 1 >> 1);
          }
          else {
            pVar7 = (pel)((uint)pSrc[uiSrcStride + -2 + iVar1] + (uint)pSrc[uiSrcStride + iVar1 + 2]
                          + (uint)pSrc[iVar1 + -2] + (uint)pSrc[iVar1 + 2] +
                          ((uint)pSrc[uiSrcStride + iVar1] + (uint)pSrc[iVar1]) * 2 + 4 >> 3);
            pVar4 = (pel)((uint)pSrc[iVar1 + uiSrcStride + -1] + (uint)pSrc[uiSrcStride + iVar1 + 3]
                          + (uint)pSrc[iVar1 + -1] + (uint)pSrc[iVar1 + 3] +
                          ((uint)pSrc[uiSrcStride + iVar1 + 1] + (uint)pSrc[iVar1 + 1]) * 2 + 4 >> 3
                         );
          }
          pDst[lVar5 >> 0x20] = pVar7;
          pDst[iVar6] = pVar4;
          iVar6 = iVar6 + 2;
          lVar5 = lVar5 + 0x200000000;
          lVar3 = lVar3 + 4;
        } while ((ulong)(uint)uiCWidth << 2 != lVar3);
      }
      pDst = pDst + uiDstStride;
      pSrc = pSrc + uiSrcStride * 2;
      iVar2 = iVar2 + 1;
    } while (iVar2 != uiCHeight);
  }
  return;
}

Assistant:

void down_sample_uv(int uiCWidth, int uiCHeight, int bitDept, pel *pSrc, int uiSrcStride, pel *pDst, int uiDstStride)
{
    int val_u, val_v;

    for (int j = 0; j < uiCHeight; j++)
    {
        for (int i = 0; i < uiCWidth; i++)
        {
            int i2 = i << 1;
            int i4 = i << 2;
            if (i == 0)
            {
                val_u = (pSrc[i4] + pSrc[i4 + uiSrcStride] + 1) >> 1;
                val_v = (pSrc[i4 + 1] + pSrc[i4 + 1 + uiSrcStride] + 1) >> 1;
            }
            else
            {
                val_u = (pSrc[i4] * 2 + pSrc[i4 + 2] + pSrc[i4 - 2] + pSrc[i4 + uiSrcStride] * 2
                         + pSrc[i4 + uiSrcStride + 2] + pSrc[i4 + uiSrcStride - 2] + 4) >> 3;
                val_v = (pSrc[i4 + 1] * 2 + pSrc[i4 + 3] + pSrc[i4 - 1] + pSrc[i4 + 1 + uiSrcStride] * 2
                    + pSrc[i4 + uiSrcStride + 3] + pSrc[i4 + uiSrcStride - 1] + 4) >> 3;
            }

            pDst[i2    ] = val_u;
            pDst[i2 + 1] = val_v;
        }
        pDst += uiDstStride;
        pSrc += uiSrcStride * 2;
    }
}